

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

ON_wString __thiscall
ON_wString::FromCurrentCoordinatedUniversalTime
          (ON_wString *this,ON_DateFormat date_format,ON_TimeFormat time_format,
          wchar_t date_separator,wchar_t date_time_separator,wchar_t time_separator)

{
  tm *__src;
  tm *t;
  time_t gmt;
  tm current_time;
  wchar_t time_separator_local;
  wchar_t date_time_separator_local;
  wchar_t date_separator_local;
  ON_TimeFormat time_format_local;
  ON_DateFormat date_format_local;
  
  current_time.tm_zone._4_4_ = time_separator;
  memset(&gmt,0,0x38);
  t = (tm *)time((time_t *)0x0);
  __src = gmtime((time_t *)&t);
  if (__src != (tm *)0x0) {
    memcpy(&gmt,__src,0x38);
  }
  FromTime(this,(tm *)&gmt,date_format,time_format,date_separator,date_time_separator,
           current_time.tm_zone._4_4_);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::FromCurrentCoordinatedUniversalTime(
  ON_DateFormat date_format,
  ON_TimeFormat time_format,
  wchar_t date_separator,
  wchar_t date_time_separator,
  wchar_t time_separator
)
{
  struct tm current_time;
  memset(&current_time,0,sizeof(current_time));
  time_t gmt = time(0);
  const struct tm* t = gmtime(&gmt);
  if ( t )
    current_time = *t;
  return ON_wString::FromTime(
    current_time,
    date_format,
    time_format,
    date_separator,
    date_time_separator,
    time_separator
  );
}